

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint32_t __thiscall CLIParser::next_uint(CLIParser *this)

{
  char *pcVar1;
  uint uVar2;
  runtime_error *prVar3;
  unsigned_long uVar4;
  allocator local_49;
  string local_48 [32];
  unsigned_long local_28;
  uint64_t val;
  CLIParser *local_10;
  CLIParser *this_local;
  
  local_10 = this;
  if (this->argc == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Tried to parse uint, but nothing left in arguments");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = *this->argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar1,&local_49);
  uVar4 = std::__cxx11::stoul((string *)local_48,(size_t *)0x0,10);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = uVar4;
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (uVar2 < uVar4) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"next_uint() out of range");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->argc = this->argc + -1;
  this->argv = this->argv + 1;
  return (uint32_t)local_28;
}

Assistant:

uint32_t next_uint()
	{
		if (!argc)
		{
			THROW("Tried to parse uint, but nothing left in arguments");
		}

		uint64_t val = stoul(*argv);
		if (val > numeric_limits<uint32_t>::max())
		{
			THROW("next_uint() out of range");
		}

		argc--;
		argv++;

		return uint32_t(val);
	}